

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

void * Gia_ManUpdateTimMan(Gia_Man_t *p,Vec_Int_t *vBoxPres)

{
  int iVar1;
  int iVar2;
  Tim_Man_t *pTVar3;
  
  pTVar3 = (Tim_Man_t *)p->pManTime;
  if (pTVar3 == (Tim_Man_t *)0x0) {
    __assert_fail("pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x29f,"void *Gia_ManUpdateTimMan(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = vBoxPres->nSize;
  iVar2 = Tim_ManBoxNum(pTVar3);
  if (iVar1 == iVar2) {
    pTVar3 = Tim_ManTrim(pTVar3,vBoxPres);
    return pTVar3;
  }
  __assert_fail("Vec_IntSize(vBoxPres) == Tim_ManBoxNum(pManTime)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                ,0x2a0,"void *Gia_ManUpdateTimMan(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void * Gia_ManUpdateTimMan( Gia_Man_t * p, Vec_Int_t * vBoxPres )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    assert( pManTime != NULL );
    assert( Vec_IntSize(vBoxPres) == Tim_ManBoxNum(pManTime) );
    return Tim_ManTrim( pManTime, vBoxPres );
}